

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_change_stream_priority
              (nghttp2_session *session,int32_t stream_id,nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *in_RDX;
  int in_ESI;
  long in_RDI;
  nghttp2_priority_spec pri_spec_copy;
  nghttp2_stream *stream;
  int rv;
  int32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (*(char *)(in_RDI + 0xb72) == '\x01') {
    local_4 = 0;
  }
  else if ((in_ESI == 0) || (in_ESI == (int)(in_RDX->pq_entry).index)) {
    local_4 = -0x1f5;
  }
  else {
    pnVar2 = nghttp2_session_get_stream_raw
                       ((nghttp2_session *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    if (pnVar2 == (nghttp2_stream *)0x0) {
      local_4 = -0x1f5;
    }
    else {
      nghttp2_priority_spec_normalize_weight((nghttp2_priority_spec *)&stack0xffffffffffffffc4);
      local_4 = nghttp2_session_reprioritize_stream
                          ((nghttp2_session *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                           (nghttp2_priority_spec *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      iVar1 = nghttp2_is_fatal(local_4);
      if (iVar1 == 0) {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_change_stream_priority(
  nghttp2_session *session, int32_t stream_id,
  const nghttp2_priority_spec *pri_spec) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec_copy;

  if (session->pending_no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || stream_id == pri_spec->stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  pri_spec_copy = *pri_spec;
  nghttp2_priority_spec_normalize_weight(&pri_spec_copy);

  rv = nghttp2_session_reprioritize_stream(session, stream, &pri_spec_copy);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  /* We don't intentionally call nghttp2_session_adjust_idle_stream()
     so that idle stream created by this function, and existing ones
     are kept for application.  We will adjust number of idle stream
     in nghttp2_session_mem_send2 or nghttp2_session_mem_recv2 is
     called. */
  return 0;
}